

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modes.c
# Opt level: O3

int overwrite_mode(int f,int n)

{
  int iVar1;
  byte bVar2;
  
  iVar1 = changemode(f,n,"overwrite");
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    if ((f & 7U) == 0) {
      curbp->b_flag = curbp->b_flag ^ 8;
    }
    else {
      if (n < 1) {
        bVar2 = curbp->b_flag & 0xf7;
      }
      else {
        bVar2 = curbp->b_flag | 8;
      }
      curbp->b_flag = bVar2;
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int
overwrite_mode(int f, int n)
{
	if (changemode(f, n, "overwrite") == FALSE)
		return (FALSE);
	if (f & FFARG) {
		if (n <= 0)
			curbp->b_flag &= ~BFOVERWRITE;
		else
			curbp->b_flag |= BFOVERWRITE;
	} else
		curbp->b_flag ^= BFOVERWRITE;
	return (TRUE);
}